

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

void __thiscall
restincurl::SystemException::SystemException(SystemException *this,string *msg,int e)

{
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,msg," ");
  __rhs = strerror(e);
  std::operator+(&bStack_58,&local_38,__rhs);
  Exception::Exception(&this->super_Exception,&bStack_58);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&this->super_Exception = &PTR__runtime_error_00113bb0;
  this->err_ = e;
  return;
}

Assistant:

SystemException(const std::string& msg, const int e) : Exception(msg + " " + strerror(e)), err_{e} {}